

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib525.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  timeval tVar8;
  timeval older;
  timeval older_00;
  int ec_10;
  CURLMcode ec_9;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_29c;
  CURLMcode ec_8;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_e0;
  int local_d4;
  long lStack_d0;
  int running;
  CURLM *m;
  stat file_info;
  int hd;
  FILE *hd_src;
  CURL *curl;
  int res;
  char *URL_local;
  
  curl._4_4_ = 0;
  lStack_d0 = 0;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_e0 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_e0;
  if (libtest_arg2 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: lib529 [url] [uploadfile]\n");
    URL_local._4_4_ = 0x76;
  }
  else {
    __stream = fopen64(libtest_arg2,"rb");
    uVar1 = _stderr;
    if (__stream == (FILE *)0x0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      curl_mfprintf(uVar1,"fopen failed with error: %d (%s)\n",iVar2,pcVar4);
      curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg2);
      URL_local._4_4_ = 0x75;
    }
    else {
      iVar2 = fileno(__stream);
      file_info.__glibc_reserved[2]._4_4_ = fstat64(iVar2,(stat64 *)&m);
      uVar1 = _stderr;
      if (file_info.__glibc_reserved[2]._4_4_ == -1) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        curl_mfprintf(uVar1,"fstat() failed with error: %d (%s)\n",iVar2,pcVar4);
        curl_mfprintf(_stderr,"ERROR: cannot open file (%s)\n",libtest_arg2);
        fclose(__stream);
        URL_local._4_4_ = 0x74;
      }
      else {
        iVar2 = curl_global_init(3);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar5 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                        ,0x4a,iVar2,uVar5);
          curl._4_4_ = iVar2;
        }
        if (curl._4_4_ == 0) {
          lVar6 = curl_easy_init();
          if (lVar6 == 0) {
            curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                          ,0x50);
            curl._4_4_ = 0x7c;
          }
          if (curl._4_4_ == 0) {
            iVar2 = curl_easy_setopt(lVar6,0x2e,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                            ,0x53,iVar2,uVar5);
              curl._4_4_ = iVar2;
            }
            if (curl._4_4_ == 0) {
              iVar2 = curl_easy_setopt(lVar6,0x2712,URL);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar5 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                              ,0x56,iVar2,uVar5);
                curl._4_4_ = iVar2;
              }
              if (curl._4_4_ == 0) {
                iVar2 = curl_easy_setopt(lVar6,0x29,1);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar5 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                ,0x59,iVar2,uVar5);
                  curl._4_4_ = iVar2;
                }
                if (curl._4_4_ == 0) {
                  iVar2 = curl_easy_setopt(lVar6,0x2721,"-");
                  uVar1 = _stderr;
                  if (iVar2 != 0) {
                    uVar5 = curl_easy_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                  ,0x5c,iVar2,uVar5);
                    curl._4_4_ = iVar2;
                  }
                  if (curl._4_4_ == 0) {
                    iVar2 = curl_easy_setopt(lVar6,0x2719,__stream);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar5 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                    ,0x5f,iVar2,uVar5);
                      curl._4_4_ = iVar2;
                    }
                    if (curl._4_4_ == 0) {
                      iVar2 = curl_easy_setopt(lVar6,0x75a3,file_info.st_rdev);
                      uVar1 = _stderr;
                      if (iVar2 != 0) {
                        uVar5 = curl_easy_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                      ,0x6a,iVar2,uVar5);
                        curl._4_4_ = iVar2;
                      }
                      if (curl._4_4_ == 0) {
                        lStack_d0 = curl_multi_init();
                        if (lStack_d0 == 0) {
                          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                        ,0x6c);
                          curl._4_4_ = 0x7b;
                        }
                        if (curl._4_4_ == 0) {
                          iVar2 = curl_multi_add_handle(lStack_d0,lVar6);
                          uVar1 = _stderr;
                          if (iVar2 != 0) {
                            uVar5 = curl_multi_strerror(iVar2);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                          ,0x6e,iVar2,uVar5);
                            curl._4_4_ = iVar2;
                          }
                          if (curl._4_4_ == 0) {
                            while( true ) {
                              local_29c = -99;
                              rd.__fds_bits[0xf] = 1;
                              iVar2 = curl_multi_perform(lStack_d0,&local_d4);
                              uVar1 = _stderr;
                              if (iVar2 == 0) {
                                if (local_d4 < 0) {
                                  curl_mfprintf(_stderr,
                                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                                ,0x78,local_d4);
                                  curl._4_4_ = 0x7a;
                                }
                              }
                              else {
                                uVar5 = curl_multi_strerror(iVar2);
                                curl_mfprintf(uVar1,
                                              "%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                              ,0x78,iVar2,uVar5);
                                curl._4_4_ = iVar2;
                              }
                              if (curl._4_4_ != 0) break;
                              tVar8 = tutil_tvnow();
                              older.tv_usec = tv_test_start.tv_usec;
                              older.tv_sec = tv_test_start.tv_sec;
                              lVar7 = tutil_tvdiff(tVar8,older);
                              if (60000 < lVar7) {
                                curl_mfprintf(_stderr,
                                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                              ,0x7a);
                                curl._4_4_ = 0x7d;
                              }
                              if ((curl._4_4_ != 0) || (local_d4 == 0)) break;
                              for (__arr._4_4_ = 0; __arr._4_4_ < 0x10;
                                  __arr._4_4_ = __arr._4_4_ + 1) {
                                wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                              }
                              for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                                  __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                                exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                              }
                              for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10;
                                  __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                                (&ec_8 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
                                (&ec_8 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
                              }
                              iVar2 = curl_multi_fdset(lStack_d0,wr.__fds_bits + 0xf,
                                                       exc.__fds_bits + 0xf,&ec_8,&local_29c);
                              uVar1 = _stderr;
                              if (iVar2 == 0) {
                                if (local_29c < -1) {
                                  curl_mfprintf(_stderr,
                                                "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                                ,0x83,local_29c);
                                  curl._4_4_ = 0x7a;
                                }
                              }
                              else {
                                uVar5 = curl_multi_strerror(iVar2);
                                curl_mfprintf(uVar1,
                                              "%s:%d curl_multi_fdset() failed, with code %d (%s)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                              ,0x83,iVar2,uVar5);
                                curl._4_4_ = iVar2;
                              }
                              if (curl._4_4_ != 0) break;
                              iVar2 = select_wrapper(local_29c + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                                     (fd_set *)(exc.__fds_bits + 0xf),
                                                     (fd_set *)&ec_8,
                                                     (timeval *)(rd.__fds_bits + 0xf));
                              if (iVar2 == -1) {
                                piVar3 = __errno_location();
                                uVar1 = _stderr;
                                iVar2 = *piVar3;
                                pcVar4 = strerror(iVar2);
                                curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                              ,0x87,iVar2,pcVar4);
                                curl._4_4_ = 0x79;
                              }
                              if (curl._4_4_ != 0) break;
                              tVar8 = tutil_tvnow();
                              older_00.tv_usec = tv_test_start.tv_usec;
                              older_00.tv_sec = tv_test_start.tv_sec;
                              lVar7 = tutil_tvdiff(tVar8,older_00);
                              if (60000 < lVar7) {
                                curl_mfprintf(_stderr,
                                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib525.c"
                                              ,0x89);
                                curl._4_4_ = 0x7d;
                              }
                              if (curl._4_4_ != 0) break;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          curl_multi_remove_handle(lStack_d0,lVar6);
          curl_multi_cleanup(lStack_d0);
          curl_easy_cleanup(lVar6);
          curl_global_cleanup();
          fclose(__stream);
          URL_local._4_4_ = curl._4_4_;
        }
        else {
          fclose(__stream);
          URL_local._4_4_ = curl._4_4_;
        }
      }
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  FILE *hd_src = NULL;
  int hd;
  struct_stat file_info;
  CURLM *m = NULL;
  int running;

  start_test_timing();

  if(!libtest_arg2) {
#ifdef LIB529
    /* test 529 */
    fprintf(stderr, "Usage: lib529 [url] [uploadfile]\n");
#else
    /* test 525 */
    fprintf(stderr, "Usage: lib525 [url] [uploadfile]\n");
#endif
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    fprintf(stderr, "fopen failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg2);
    return TEST_ERR_FOPEN;
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    fprintf(stderr, "fstat() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "ERROR: cannot open file (%s)\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_FSTAT;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(hd_src);
    return res;
  }

  easy_init(curl);

  /* enable uploading */
  easy_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* specify target */
  easy_setopt(curl, CURLOPT_URL, URL);

  /* go verbose */
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* use active FTP */
  easy_setopt(curl, CURLOPT_FTPPORT, "-");

  /* now specify which file to upload */
  easy_setopt(curl, CURLOPT_READDATA, hd_src);

  /* NOTE: if you want this code to work on Windows with libcurl as a DLL, you
     MUST also provide a read callback with CURLOPT_READFUNCTION. Failing to
     do so will give you a crash since a DLL may not use the variable's memory
     when passed in to it from an app like this. */

  /* Set the size of the file to upload (optional).  If you give a *_LARGE
     option you MUST make sure that the type of the passed-in argument is a
     curl_off_t. If you use CURLOPT_INFILESIZE (without _LARGE) you must
     make sure that to pass in a type 'long' argument. */
  easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)file_info.st_size);

  multi_init(m);

  multi_add_handle(m, curl);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB529
  /* test 529 */
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(m, curl);
  curl_multi_cleanup(m);
  curl_easy_cleanup(curl);
  curl_global_cleanup();
#else
  /* test 525 */
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(m, curl);
  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();
#endif

  /* close the local file */
  fclose(hd_src);

  return res;
}